

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmAddiEa<(moira::Instr)120,(moira::Mode)7,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  StrWriter *pSVar2;
  Ea<(moira::Mode)7,_(moira::Size)2> dst;
  Ea<(moira::Mode)7,_(moira::Size)2> local_44;
  
  uVar1 = dasmRead<(moira::Size)2>(this,addr);
  local_44.reg = op & 7;
  local_44.pc = *addr;
  local_44.ext1 = dasmRead<(moira::Size)2>(this,addr);
  pSVar2 = StrWriter::operator<<(str);
  pSVar2 = StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,(Align)(this->tab).raw);
  StrWriter::operator<<(pSVar2,(Ims)(int)(short)uVar1);
  StrWriter::operator<<(pSVar2,", ");
  StrWriter::operator<<(pSVar2,&local_44);
  return;
}

Assistant:

void
Moira::dasmAddiEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Ims      ( SEXT<S>(dasmRead<S>(addr)) );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}